

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GcodePovray.cpp
# Opt level: O3

double FindLocalLayerHeight
                 (vector<vector3,_std::allocator<vector3>_> *existing_layer,vector3 *test_vertex,
                 bool is_first_layer)

{
  pointer pvVar1;
  bool bVar2;
  double *pdVar3;
  undefined7 in_register_00000011;
  long lVar4;
  double dVar5;
  double in_XMM3_Qa;
  double dVar6;
  double in_XMM4_Qa;
  double dVar7;
  
  if ((int)CONCAT71(in_register_00000011,is_first_layer) == 0) {
    pvVar1 = (existing_layer->super__Vector_base<vector3,_std::allocator<vector3>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar4 = (long)(existing_layer->super__Vector_base<vector3,_std::allocator<vector3>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pvVar1;
    if (lVar4 != 0) {
      lVar4 = (lVar4 >> 3) * -0x5555555555555555;
      lVar4 = lVar4 + (ulong)(lVar4 == 0);
      pdVar3 = &pvVar1->z;
      dVar5 = 1000.0;
      do {
        dVar6 = test_vertex->x - ((vector3 *)(pdVar3 + -2))->x;
        dVar7 = test_vertex->y - pdVar3[-1];
        dVar6 = SQRT(dVar6 * dVar6 + dVar7 * dVar7);
        bVar2 = dVar6 < dVar5;
        if (dVar5 <= dVar6) {
          dVar6 = dVar5;
        }
        dVar5 = dVar6;
        in_XMM4_Qa = (double)(~-(ulong)bVar2 & (ulong)in_XMM4_Qa | (ulong)*pdVar3 & -(ulong)bVar2);
        pdVar3 = pdVar3 + 3;
        lVar4 = lVar4 + -1;
        in_XMM3_Qa = in_XMM4_Qa;
      } while (lVar4 != 0);
    }
    return test_vertex->z - in_XMM3_Qa;
  }
  return test_vertex->z;
}

Assistant:

double FindLocalLayerHeight(std::vector<vector3> *existing_layer, vector3 &test_vertex, bool is_first_layer)
{
  if (is_first_layer)
  {
    return test_vertex.z;
  }

  vector3 temp_vertex, nearest_vertex;
  double minimun_distance = 1000, temp_distance;
  for (int i = 0; i < existing_layer->size(); i++)
  {
    temp_vertex = (*existing_layer)[i];
    temp_distance = (test_vertex - temp_vertex).XYLength();
    if (temp_distance < minimun_distance)
    {
      minimun_distance = temp_distance;
      nearest_vertex = temp_vertex;
    }
  }

  return test_vertex.z - nearest_vertex.z;
}